

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O2

value_t * __thiscall deci::dictionary_t::Get(dictionary_t *this,value_t *key)

{
  const_iterator cVar1;
  runtime_error *this_00;
  value_t *xkey;
  
  xkey = key;
  cVar1 = std::
          _Hashtable<deci::value_t_*,_std::pair<deci::value_t_*const,_deci::value_t_*>,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>,_std::__detail::_Select1st,_deci::value_equal_to_t,_deci::value_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->storage)._M_h,&xkey);
  if (cVar1.super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>._M_cur
      != (__node_type *)0x0) {
    return *(value_t **)
            ((long)cVar1.
                   super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                   ._M_cur + 0x10);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Element not found");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const value_t& dictionary_t::Get(const value_t& key) const {
    value_t* xkey = &const_cast<value_t&>(key);
    auto i = this->storage.find(xkey);
    if (i != this->storage.cend()) {
      return *i->second;
    }
    throw std::runtime_error("Element not found");
  }